

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBuffer.c
# Opt level: O3

JL_STATUS JlBufferAdd(JlBuffer *BufferContext,void *Data,size_t DataSize)

{
  size_t OriginalSize;
  JL_STATUS JVar1;
  uint8_t *puVar2;
  size_t sVar3;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if (DataSize != 0 && (Data != (void *)0x0 && BufferContext != (JlBuffer *)0x0)) {
    sVar3 = BufferContext->BufferUsed;
    OriginalSize = BufferContext->BufferAllocated;
    if (OriginalSize - sVar3 < DataSize) {
      puVar2 = (uint8_t *)JlRealloc(BufferContext->Buffer,OriginalSize,OriginalSize + 0x4000);
      if (puVar2 == (uint8_t *)0x0) {
        return JL_STATUS_OUT_OF_MEMORY;
      }
      BufferContext->BufferAllocated = OriginalSize + 0x4000;
      BufferContext->Buffer = puVar2;
      sVar3 = BufferContext->BufferUsed;
    }
    else {
      puVar2 = BufferContext->Buffer;
    }
    memcpy(puVar2 + sVar3,Data,DataSize);
    BufferContext->BufferUsed = BufferContext->BufferUsed + DataSize;
    JVar1 = JL_STATUS_SUCCESS;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlBufferAdd
    (
        JlBuffer*       BufferContext,
        void const*     Data,
        size_t          DataSize
    )
{
    JL_STATUS jlStatus;

    if(     NULL != BufferContext
        &&  NULL != Data
        &&  0 != DataSize )
    {
        size_t amountLeft = BufferContext->BufferAllocated - BufferContext->BufferUsed;
        if( amountLeft < DataSize )
        {
            size_t   newSize = BufferContext->BufferAllocated + BUFFER_GROW_SIZE;
            uint8_t* newBuffer = JlRealloc( BufferContext->Buffer, BufferContext->BufferAllocated, newSize );

            if( NULL != newBuffer )
            {
                BufferContext->BufferAllocated = newSize;
                BufferContext->Buffer = newBuffer;
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_OUT_OF_MEMORY;
            }
        }
        else
        {
            // No need to grow buffer
            jlStatus = JL_STATUS_SUCCESS;
        }

        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Append data
            memcpy( BufferContext->Buffer + BufferContext->BufferUsed, Data, DataSize );
            BufferContext->BufferUsed += DataSize;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}